

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O0

void default_backtrace_host(_func_void_ptr_int_void_ptr *writer)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  code *in_RDI;
  int level;
  int depth;
  int max_depth;
  sysprof *sp;
  int local_1c;
  
  uVar1 = 0x200;
  if (sysprof.opt.mode == '\x01') {
    uVar1 = 7;
  }
  iVar2 = backtrace(default_backtrace_host::backtrace_buf,uVar1);
  local_1c = 6;
  while ((local_1c < iVar2 &&
         (lVar3 = (*in_RDI)(local_1c + -5,default_backtrace_host::backtrace_buf[local_1c]),
         lVar3 != 0))) {
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void default_backtrace_host(void *(writer)(int frame_no, void *addr))
{
  static void *backtrace_buf[SYSPROF_BACKTRACE_FRAME_MAX] = {};

  struct sysprof *sp = &sysprof;
  int max_depth = sp->opt.mode == LUAM_SYSPROF_LEAF
                  ? SYSPROF_HANDLER_STACK_DEPTH + 1
                  : SYSPROF_BACKTRACE_FRAME_MAX;
  const int depth = backtrace(backtrace_buf, max_depth);
  int level;

  lj_assertX(depth <= max_depth, "depth of C stack is too big");
  for (level = SYSPROF_HANDLER_STACK_DEPTH; level < depth; ++level) {
    if (!writer(level - SYSPROF_HANDLER_STACK_DEPTH + 1, backtrace_buf[level]))
      return;
  }
}